

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.h
# Opt level: O1

bool __thiscall ExactFloat::UnsignedLess(ExactFloat *this,ExactFloat *b)

{
  bool bVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  double in_XMM0_Qa;
  double __x;
  
  if (this->bn_exp_ == 0x7ffffffe) {
    return false;
  }
  if (b->bn_exp_ == 0x7ffffffd) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (b->bn_exp_ != 0x7ffffffe && this->bn_exp_ != 0x7ffffffd) {
      __x = exp(this,in_XMM0_Qa);
      exp(b,__x);
      if (extraout_EAX == extraout_EAX_00) {
        if (this->bn_exp_ < b->bn_exp_) {
          iVar2 = ScaleAndCompare(b,this);
          bVar1 = 0 < iVar2;
        }
        else {
          iVar2 = ScaleAndCompare(this,b);
          bVar1 = SUB41((uint)iVar2 >> 0x1f,0);
        }
      }
      else {
        bVar1 = extraout_EAX < extraout_EAX_00;
      }
    }
  }
  return bVar1;
}

Assistant:

inline bool ExactFloat::is_zero() const { return bn_exp_ == kExpZero; }